

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_functions.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
__thiscall
duckdb::DefaultFunctionGenerator::GetDefaultEntries_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *__return_storage_ptr__,DefaultFunctionGenerator *this)

{
  int iVar1;
  InternalException *this_00;
  undefined8 *puVar2;
  char *params;
  allocator local_79;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_78;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  params = "current_role";
  puVar2 = &internal_macros;
  local_78 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             __return_storage_ptr__;
  while( true ) {
    ::std::__cxx11::string::string((string *)&local_50,params,&local_79);
    StringUtil::Lower(&local_70,&local_50);
    iVar1 = ::std::__cxx11::string::compare((char *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (iVar1 != 0) break;
    iVar1 = ::std::__cxx11::string::compare
                      ((char *)&(this->schema->super_InCatalogEntry).super_CatalogEntry.name);
    if (iVar1 == 0) {
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*const&>(local_78,(char **)(puVar2 + 1));
    }
    params = (char *)puVar2[0x1c];
    puVar2 = puVar2 + 0x1b;
    if (params == (char *)0x0) {
      return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)local_78;
    }
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,"Default macro name %s should be lowercase","");
  InternalException::InternalException<char_const*>(this_00,&local_70,params);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

vector<string> DefaultFunctionGenerator::GetDefaultEntries() {
	vector<string> result;
	for (idx_t index = 0; internal_macros[index].name != nullptr; index++) {
		if (StringUtil::Lower(internal_macros[index].name) != internal_macros[index].name) {
			throw InternalException("Default macro name %s should be lowercase", internal_macros[index].name);
		}
		if (internal_macros[index].schema == schema.name) {
			result.emplace_back(internal_macros[index].name);
		}
	}
	return result;
}